

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O2

shared_ptr<const_HawkTracer::parser::EventKlassField> __thiscall
HawkTracer::parser::EventKlass::_get_field(EventKlass *this,char *name,bool recursive)

{
  __shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  char in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2> *__r;
  shared_ptr<const_HawkTracer::parser::EventKlassField> sVar4;
  __shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2> local_50 [2];
  
  __r = *(__shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2> **)
         (name + 0x28);
  p_Var1 = *(__shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2> **)
            (name + 0x30);
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(in_register_00000011,recursive);
  do {
    if (__r == p_Var1) {
      (this->_fields_mtx).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this->_fields_mtx).super___mutex_base._M_mutex + 8) = 0;
LAB_001117e1:
      sVar4.
      super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      sVar4.
      super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (shared_ptr<const_HawkTracer::parser::EventKlassField>)
             sVar4.
             super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    std::__cxx11::string::string((string *)local_50,(string *)__r->_M_ptr);
    iVar2 = strcmp((char *)CONCAT71(in_register_00000011,recursive),(char *)local_50[0]._M_ptr);
    std::__cxx11::string::~string((string *)local_50);
    if (iVar2 == 0) {
      std::__shared_ptr<HawkTracer::parser::EventKlassField_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<HawkTracer::parser::EventKlassField,void>
                ((__shared_ptr<HawkTracer::parser::EventKlassField_const,(__gnu_cxx::_Lock_policy)2>
                  *)this,__r);
      _Var3._M_pi = extraout_RDX_02;
      goto LAB_001117e1;
    }
    _Var3._M_pi = extraout_RDX;
    if (__r->_M_ptr->_type_id == STRUCT && in_CL == '\x01') {
      std::__shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(local_50,&(__r->_M_ptr->_klass).
                             super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>
                  );
      get_field(this,(char *)local_50[0]._M_ptr,recursive);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50[0]._M_refcount);
      _Var3._M_pi = extraout_RDX_00;
      if ((this->_fields_mtx).super___mutex_base._M_mutex.__align != 0) goto LAB_001117e1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(this->_fields_mtx).super___mutex_base._M_mutex + 8));
      _Var3._M_pi = extraout_RDX_01;
    }
    __r = __r + 1;
  } while( true );
}

Assistant:

std::shared_ptr<const EventKlassField> EventKlass::_get_field(const char* name, bool recursive) const
{
    for (const auto& field : _fields)
    {
        if (strcmp(name, field->get_name().c_str()) == 0)
        {
            return field;
        }
        else if (field->get_type_id() == FieldTypeId::STRUCT && recursive)
        {
            auto base_field = field->get_klass()->get_field(name, recursive);
            if (base_field)
            {
                return base_field;
            }
        }
    }

    return nullptr;
}